

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.hpp
# Opt level: O0

__pid_t __thiscall ycqian::barrier::wait(barrier *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lk;
  barrier *this_local;
  
  lk._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex);
  if (this->current == 1) {
    this->current = this->count;
    std::condition_variable::notify_all();
  }
  else {
    this->current = this->current - 1;
    std::condition_variable::wait((unique_lock *)&this->cv);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return extraout_EAX;
}

Assistant:

void wait(){
            std::unique_lock<std::mutex> lk(mutex);
            if (current == 1) {
                current = count;//reset
                cv.notify_all();
            } else {
                current--;
                cv.wait(lk);
            }
        }